

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::RegularExpression::replace
          (RegularExpression *this,XMLCh *matchString,XMLCh *replaceString,XMLSize_t start,
          XMLSize_t end,MemoryManager *manager)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  BaseRefVectorOf<xercesc_4_0::Match> *this_00;
  undefined4 extraout_var;
  RegularExpression *this_01;
  XMLCh *pXVar5;
  RuntimeException *this_02;
  RegularExpression *this_03;
  ulong getAt;
  ulong uVar6;
  XMLBuffer result;
  
  bVar1 = matches(this,L"",manager);
  if (!bVar1) {
    this_00 = (BaseRefVectorOf<xercesc_4_0::Match> *)XMemory::operator_new(0x30,manager);
    RefVectorOf<xercesc_4_0::Match>::RefVectorOf
              ((RefVectorOf<xercesc_4_0::Match> *)this_00,10,true,manager);
    allMatches(this,matchString,start,end,(RefVectorOf<xercesc_4_0::Match> *)this_00,manager);
    result.fIndex = 0;
    result.fCapacity = 0x3ff;
    result.fFullSize = 0;
    result.fUsed = false;
    result.fFullHandler = (XMLBufferFullHandler *)0x0;
    result.fMemoryManager = manager;
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,0x800);
    result.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar2);
    *result.fBuffer = L'\0';
    getAt = 0;
    while( true ) {
      iVar2 = (int)start;
      uVar6 = (ulong)iVar2;
      if (this_00->fCurCount <= getAt) break;
      this_01 = (RegularExpression *)BaseRefVectorOf<xercesc_4_0::Match>::elementAt(this_00,getAt);
      this_03 = this_01;
      iVar3 = Match::getStartPos((Match *)this_01,0);
      if (iVar3 - iVar2 != 0 && iVar2 <= iVar3) {
        this_03 = (RegularExpression *)&result;
        XMLBuffer::append((XMLBuffer *)this_03,matchString + uVar6,(long)(iVar3 - iVar2));
      }
      subInExp(this_03,replaceString,matchString,(Match *)this_01,&result,manager);
      uVar4 = Match::getEndPos((Match *)this_01,0);
      start = (XMLSize_t)uVar4;
      getAt = getAt + 1;
    }
    if (uVar6 <= end && end - uVar6 != 0) {
      XMLBuffer::append(&result,matchString + uVar6,end - uVar6);
    }
    result.fBuffer[result.fIndex] = L'\0';
    pXVar5 = XMLString::replicate(result.fBuffer,manager);
    XMLBuffer::~XMLBuffer(&result);
    (*this_00->_vptr_BaseRefVectorOf[1])(this_00);
    return pXVar5;
  }
  this_02 = (RuntimeException *)__cxa_allocate_exception();
  RuntimeException::RuntimeException
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RegularExpression.cpp"
             ,0x33f,Regex_RepPatMatchesZeroString,manager);
  __cxa_throw(this_02,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLCh* RegularExpression::replace(const XMLCh* const matchString,
                                  const XMLCh* const replaceString,
                                  const XMLSize_t start, const XMLSize_t end,
                                  MemoryManager* const manager) const
{
    // check if matches zero length string - throw error if so
    if(matches(XMLUni::fgZeroLenString, manager)){
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Regex_RepPatMatchesZeroString, manager);
    }

    RefVectorOf<Match> *subEx = new (manager) RefVectorOf<Match>(10, true, manager);
    Janitor<RefVectorOf<Match> > janSubEx(subEx);

    allMatches(matchString, start, end, subEx, manager);

    XMLBuffer result(1023, manager);
    int tokStart = (int)start;

    XMLSize_t i = 0;
    for(; i < subEx->size(); ++i) {
        Match *match = subEx->elementAt(i);
        int matchStart = match->getStartPos(0);

        if(matchStart > tokStart)
            result.append(matchString + tokStart, matchStart - tokStart);
        subInExp(replaceString, matchString, match, result, manager);

        tokStart = match->getEndPos(0);
    }

    if(end > (XMLSize_t)tokStart)
        result.append(matchString + tokStart, end - tokStart);

    return XMLString::replicate(result.getRawBuffer(), manager);
}